

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btGImpactCollisionAlgorithm::gimpacttrimeshpart_vs_plane_collision
          (btGImpactCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btGImpactMeshShapePart *shape0,
          btStaticPlaneShape *shape1,bool swapped)

{
  eBT_PLANE_INTERSECTION_TYPE eVar1;
  btScalar *pbVar2;
  int iVar3;
  long *in_RCX;
  btGImpactMeshShapePart *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  btGImpactCollisionAlgorithm *in_RDI;
  long *in_R8;
  byte in_R9B;
  float fVar4;
  btScalar bVar5;
  btVector3 bVar6;
  btScalar distance;
  int vi;
  btVector3 vertex;
  btScalar margin;
  btAABB tribox;
  btVector4 plane;
  btPlaneShape *planeshape;
  btTransform orgtrans1;
  btTransform orgtrans0;
  undefined4 in_stack_fffffffffffffea8;
  btScalar in_stack_fffffffffffffeac;
  btGImpactMeshShapePart *in_stack_fffffffffffffeb0;
  btCollisionObjectWrapper *in_stack_fffffffffffffeb8;
  btVector4 *in_stack_fffffffffffffec0;
  btCollisionObjectWrapper *body1Wrap_00;
  undefined4 in_stack_fffffffffffffec8;
  btScalar in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed8;
  btScalar in_stack_fffffffffffffedc;
  btTransform *in_stack_fffffffffffffee0;
  btCollisionObjectWrapper *local_110;
  btCollisionShape *local_108;
  int local_100;
  undefined1 local_fc [20];
  undefined1 local_e8 [16];
  undefined1 auStack_d8 [16];
  btVector3 local_c8;
  long *local_b8;
  undefined1 local_6c [67];
  byte local_29;
  long *local_28;
  long *local_20;
  btGImpactMeshShapePart *local_18;
  btCollisionObjectWrapper *local_10;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btCollisionObjectWrapper::getWorldTransform(in_RSI);
  btTransform::btTransform
            ((btTransform *)in_stack_fffffffffffffeb0,
             (btTransform *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  btCollisionObjectWrapper::getWorldTransform((btCollisionObjectWrapper *)local_18);
  btTransform::btTransform
            ((btTransform *)in_stack_fffffffffffffeb0,
             (btTransform *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_b8 = local_28;
  btVector4::btVector4((btVector4 *)0x1d2c4f);
  btPlaneShape::get_plane_equation_transformed
            ((btPlaneShape *)in_RDI,
             (btTransform *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0);
  btAABB::btAABB((btAABB *)in_stack_fffffffffffffeb0);
  (**(code **)(*local_20 + 0x10))(local_20,local_6c,local_e8,auStack_d8);
  (**(code **)(*local_b8 + 0x60))();
  btAABB::increment_margin((btAABB *)in_RDI,in_stack_fffffffffffffecc);
  eVar1 = btAABB::plane_classify
                    ((btAABB *)in_stack_fffffffffffffeb8,(btVector4 *)in_stack_fffffffffffffeb0);
  if (eVar1 == BT_CONST_COLLIDE_PLANE) {
    (**(code **)(*local_20 + 0xe0))();
    fVar4 = (float)(**(code **)(*local_20 + 0x60))();
    local_fc._16_4_ = (**(code **)(*local_b8 + 0x60))();
    local_fc._16_4_ = fVar4 + (float)local_fc._16_4_;
    btVector3::btVector3((btVector3 *)local_fc);
    local_100 = btGImpactMeshShapePart::getVertexCount((btGImpactMeshShapePart *)0x1d2d2b);
    while (iVar3 = local_100 + -1, local_100 != 0) {
      body1Wrap_00 = (btCollisionObjectWrapper *)local_fc;
      btGImpactMeshShapePart::getVertex
                (in_stack_fffffffffffffeb0,(int)in_stack_fffffffffffffeac,(btVector3 *)0x1d2d60);
      bVar6 = btTransform::operator()
                        (in_stack_fffffffffffffee0,
                         (btVector3 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
      ;
      local_110 = bVar6.m_floats._0_8_;
      local_fc._0_8_ = local_110;
      local_108 = bVar6.m_floats._8_8_;
      local_fc._8_8_ = local_108;
      bVar5 = btVector3::dot((btVector3 *)local_fc,&local_c8);
      pbVar2 = btVector3::operator_cast_to_float_(&local_c8);
      local_100 = iVar3;
      if ((bVar5 - pbVar2[3]) - (float)local_fc._16_4_ < 0.0) {
        if ((local_29 & 1) == 0) {
          addContactPoint(in_RDI,(btCollisionObjectWrapper *)CONCAT44(fVar4,bVar5),body1Wrap_00,
                          (btVector3 *)in_stack_fffffffffffffeb8,
                          (btVector3 *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        }
        else {
          in_stack_fffffffffffffeb0 = local_18;
          in_stack_fffffffffffffeb8 = local_10;
          bVar6 = operator-((btVector3 *)local_18);
          in_stack_fffffffffffffedc = bVar6.m_floats[0];
          in_stack_fffffffffffffee0 = bVar6.m_floats._4_8_;
          addContactPoint(in_RDI,(btCollisionObjectWrapper *)CONCAT44(fVar4,bVar5),body1Wrap_00,
                          (btVector3 *)in_stack_fffffffffffffeb8,
                          (btVector3 *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        }
      }
    }
    (**(code **)(*local_20 + 0xe8))();
  }
  return;
}

Assistant:

void btGImpactCollisionAlgorithm::gimpacttrimeshpart_vs_plane_collision(
					  const btCollisionObjectWrapper * body0Wrap,
					  const btCollisionObjectWrapper * body1Wrap,
					  const btGImpactMeshShapePart * shape0,
					  const btStaticPlaneShape * shape1,bool swapped)
{


	btTransform orgtrans0 = body0Wrap->getWorldTransform();
	btTransform orgtrans1 = body1Wrap->getWorldTransform();

	const btPlaneShape * planeshape = static_cast<const btPlaneShape *>(shape1);
	btVector4 plane;
	planeshape->get_plane_equation_transformed(orgtrans1,plane);

	//test box against plane

	btAABB tribox;
	shape0->getAabb(orgtrans0,tribox.m_min,tribox.m_max);
	tribox.increment_margin(planeshape->getMargin());

	if( tribox.plane_classify(plane)!= BT_CONST_COLLIDE_PLANE) return;

	shape0->lockChildShapes();

	btScalar margin = shape0->getMargin() + planeshape->getMargin();

	btVector3 vertex;
	int vi = shape0->getVertexCount();
	while(vi--)
	{
		shape0->getVertex(vi,vertex);
		vertex = orgtrans0(vertex);

		btScalar distance = vertex.dot(plane) - plane[3] - margin;

		if(distance<0.0)//add contact
		{
			if(swapped)
			{
				addContactPoint(body1Wrap, body0Wrap,
					vertex,
					-plane,
					distance);
			}
			else
			{
				addContactPoint(body0Wrap, body1Wrap,
					vertex,
					plane,
					distance);
			}
		}
	}

	shape0->unlockChildShapes();
}